

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.cpp
# Opt level: O0

bool cv::imwrite(string *path,Mat *m,vector<int,_std::allocator<int>_> *params)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  const_reference pvVar5;
  int in_ECX;
  vector<int,_std::allocator<int>_> *in_RDX;
  void *__child_stack;
  __fn *in_RSI;
  void *in_R8;
  size_t i_2;
  int quality;
  bool success;
  int i_1;
  uchar *p_1;
  int i;
  uchar *p;
  int c;
  Mat img;
  string ext;
  char *_ext;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff1c;
  void *in_stack_ffffffffffffff20;
  size_type sVar6;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  size_type local_b8;
  bool local_a9;
  int local_a4;
  uchar *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  uchar *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int iVar7;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int *in_stack_ffffffffffffff88;
  int local_70;
  int local_6c;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  __fn *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar3 = strrchr(pcVar3,0x2e);
  if (pcVar3 == (char *)0x0) {
    local_1 = false;
    goto LAB_00168383;
  }
  local_28 = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar3,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  Mat::clone((Mat *)&stack0xffffffffffffff80,local_18,__child_stack,in_ECX,in_R8);
  iVar2 = Mat::type((Mat *)&stack0xffffffffffffff80);
  if (iVar2 == 1) {
    iVar7 = 1;
LAB_001680b2:
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,
                                     CONCAT13(in_stack_ffffffffffffff13,
                                              CONCAT12(in_stack_ffffffffffffff12,
                                                       in_stack_ffffffffffffff10))),
                            (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffff14,
                                              CONCAT13(in_stack_ffffffffffffff13,
                                                       CONCAT12(in_stack_ffffffffffffff12,
                                                                in_stack_ffffffffffffff10))),
                                  (char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08)), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffff14,
                                             CONCAT13(in_stack_ffffffffffffff13,
                                                      CONCAT12(in_stack_ffffffffffffff12,
                                                               in_stack_ffffffffffffff10))),
                                 (char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08)), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff14,
                                          CONCAT13(in_stack_ffffffffffffff13,
                                                   CONCAT12(in_stack_ffffffffffffff12,
                                                            in_stack_ffffffffffffff10))),
                                (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                )), bVar1)) {
      local_b8 = 0;
      while (sVar6 = local_b8, sVar4 = std::vector<int,_std::allocator<int>_>::size(local_20),
            sVar6 < sVar4) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_20,local_b8);
        if (*pvVar5 == 1) {
          std::vector<int,_std::allocator<int>_>::operator[](local_20,local_b8 + 1);
          break;
        }
        local_b8 = local_b8 + 2;
      }
      std::__cxx11::string::c_str();
      iVar2 = stbi_write_jpg((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                             in_stack_ffffffffffffff80,iVar7,in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff6c);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff14,
                                       CONCAT13(in_stack_ffffffffffffff13,
                                                CONCAT12(in_stack_ffffffffffffff12,
                                                         in_stack_ffffffffffffff10))),
                              (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
      ;
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffff14,
                                              CONCAT13(in_stack_ffffffffffffff13,
                                                       CONCAT12(in_stack_ffffffffffffff12,
                                                                in_stack_ffffffffffffff10))),
                                  (char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08)), bVar1)) {
        std::__cxx11::string::c_str();
        iVar2 = stbi_write_png(pcVar3,iVar2,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                               in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff14,
                                          CONCAT13(in_stack_ffffffffffffff13,
                                                   CONCAT12(in_stack_ffffffffffffff12,
                                                            in_stack_ffffffffffffff10))),
                                (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
        if ((!bVar1) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff14,
                                                CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff12,
                                                                        in_stack_ffffffffffffff10)))
                                    ,(char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                      in_stack_ffffffffffffff08)), !bVar1)) {
          local_1 = false;
          goto LAB_0016835b;
        }
        std::__cxx11::string::c_str();
        iVar2 = stbi_write_bmp((char *)CONCAT44(iVar7,in_stack_ffffffffffffff78),
                               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                               (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                               in_stack_ffffffffffffff60);
      }
    }
    local_a9 = iVar2 != 0;
    local_1 = local_a9;
  }
  else {
    in_stack_ffffffffffffff30 = Mat::type((Mat *)&stack0xffffffffffffff80);
    if (in_stack_ffffffffffffff30 == 3) {
      iVar7 = 3;
      in_stack_ffffffffffffff70 =
           (uchar *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      for (in_stack_ffffffffffffff6c = 0; in_stack_ffffffffffffff6c < local_6c * local_70;
          in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c + 1) {
        std::swap<unsigned_char>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff70 + 2);
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + 3;
      }
      goto LAB_001680b2;
    }
    iVar7 = Mat::type((Mat *)&stack0xffffffffffffff80);
    if (iVar7 == 4) {
      iVar7 = 4;
      in_stack_ffffffffffffff60 =
           (uchar *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff2c = 4;
      for (local_a4 = 0; local_a4 < local_6c * local_70; local_a4 = local_a4 + 1) {
        std::swap<unsigned_char>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff60 + 2);
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 4;
      }
      goto LAB_001680b2;
    }
    local_1 = false;
  }
LAB_0016835b:
  Mat::~Mat((Mat *)0x168365);
  std::__cxx11::string::~string(local_48);
LAB_00168383:
  return (bool)(local_1 & 1);
}

Assistant:

bool imwrite(const std::string& path, const Mat& m, const std::vector<int>& params)
{
    const char* _ext = strrchr(path.c_str(), '.');
    if (!_ext)
    {
        // missing extension
        return false;
    }

    std::string ext = _ext;
    Mat img = m.clone();

    // bgr to rgb
    int c = 0;
    if (img.type() == CV_8UC1)
    {
        c = 1;
    }
    else if (img.type() == CV_8UC3)
    {
        c = 3;
        uchar* p = img.data;
        for (int i = 0; i < img.cols * img.rows; i++)
        {
            std::swap(p[0], p[2]);
            p += 3;
        }
    }
    else if (img.type() == CV_8UC4)
    {
        c = 4;
        uchar* p = img.data;
        for (int i = 0; i < img.cols * img.rows; i++)
        {
            std::swap(p[0], p[2]);
            p += 4;
        }
    }
    else
    {
        // unexpected image channels
        return false;
    }

    bool success = false;

    if (ext == ".jpg" || ext == ".jpeg" || ext == ".JPG" || ext == ".JPEG")
    {
        int quality = 95;
        for (size_t i = 0; i < params.size(); i += 2)
        {
            if (params[i] == IMWRITE_JPEG_QUALITY)
            {
                quality = params[i + 1];
                break;
            }
        }
        success = stbi_write_jpg(path.c_str(), img.cols, img.rows, c, img.data, quality);
    }
    else if (ext == ".png" || ext == ".PNG")
    {
        success = stbi_write_png(path.c_str(), img.cols, img.rows, c, img.data, 0);
    }
    else if (ext == ".bmp" || ext == ".BMP")
    {
        success = stbi_write_bmp(path.c_str(), img.cols, img.rows, c, img.data);
    }
    else
    {
        // unknown extension type
        return false;
    }

    return success;
}